

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall
CTcSymProp::gen_code_call
          (CTcSymProp *this,int discard,int argc,int varargs,CTcNamedArgs *named_args)

{
  int iVar1;
  int iVar2;
  CTcGenTarg *pCVar3;
  undefined8 in_RAX;
  undefined4 in_register_0000000c;
  size_t __n;
  CTcGenTarg *pCVar4;
  undefined8 uStack_38;
  
  __n = CONCAT44(in_register_0000000c,varargs);
  if ((G_cs->field_0xa8 & 1) == 0) {
    CTcTokenizer::log_error
              (0x2cf5,(ulong)(uint)(this->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                                   super_CVmHashEntryCS.super_CVmHashEntry.len_,
               (this->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS
               .super_CVmHashEntry.str_);
    return;
  }
  uStack_38 = in_RAX;
  if ((~G_cg->field_0xd0 & 0x18) == 0) {
    if ((argc != 0) || ((named_args != (CTcNamedArgs *)0x0 && (named_args->cnt != 0)))) {
      err_throw(0x9c5);
    }
    CTcGenTarg::write_op(G_cg,0x84);
    CTcGenTarg::write_op(G_cg,'h');
    pCVar4 = (CTcGenTarg *)G_cs;
    CTcDataStream::write_prop_id
              (&G_cs->super_CTcDataStream,(uint)(this->super_CTcSymPropBase).prop_);
    pCVar3 = G_cg;
    iVar1 = G_cg->sp_depth_;
    if (G_cg->max_sp_depth_ <= iVar1) {
      G_cg->max_sp_depth_ = iVar1 + 1;
    }
    pCVar3->sp_depth_ = iVar1;
  }
  else if (argc == 0) {
    CTcGenTarg::write_op(G_cg,'c');
    pCVar4 = (CTcGenTarg *)G_cs;
    CTcDataStream::write_prop_id
              (&G_cs->super_CTcDataStream,(uint)(this->super_CTcSymPropBase).prop_);
  }
  else {
    if (varargs != 0) {
      CTcGenTarg::write_op(G_cg,'v');
    }
    CTcGenTarg::write_op(G_cg,'d');
    uStack_38 = CONCAT17((char)argc,(undefined7)uStack_38);
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&uStack_38 + 7,(void *)0x1,__n);
    pCVar4 = (CTcGenTarg *)G_cs;
    CTcDataStream::write_prop_id
              (&G_cs->super_CTcDataStream,(uint)(this->super_CTcSymPropBase).prop_);
    G_cg->sp_depth_ = G_cg->sp_depth_ - argc;
  }
  CTcGenTarg::post_call_cleanup(pCVar4,named_args);
  if (discard == 0) {
    CTcGenTarg::write_op(G_cg,0x8b);
    pCVar4 = G_cg;
    iVar2 = G_cg->sp_depth_;
    iVar1 = iVar2 + 1;
    G_cg->sp_depth_ = iVar1;
    if (pCVar4->max_sp_depth_ <= iVar2) {
      pCVar4->max_sp_depth_ = iVar1;
    }
  }
  return;
}

Assistant:

void CTcSymProp::gen_code_call(int discard, int argc, int varargs,
                               CTcNamedArgs *named_args)
{
    /* 
     *   if there's no "self", we can't invoke a property without an
     *   explicit object reference 
     */
    if (!G_cs->is_self_available())
    {
        G_tok->log_error(TCERR_PROP_NEEDS_OBJ, (int)get_sym_len(), get_sym());
        return;
    }

    /* don't allow calling with arguments in speculative mode */
    if (G_cg->is_speculative()
        && (argc != 0 || (named_args != 0 && named_args->cnt != 0)))
        err_throw(VMERR_BAD_SPEC_EVAL);

    /* generate code to invoke the property of "self" */
    if (G_cg->is_speculative())
    {
        /* push 'self', then get the property in data-only mode */
        G_cg->write_op(OPC_PUSHSELF);
        G_cg->write_op(OPC_GETPROPDATA);
        G_cs->write_prop_id(get_prop());

        /* we pushed 'self' then popped it again */
        G_cg->note_push();
        G_cg->note_pop();
    }
    else if (argc == 0)
    {
        /* use the instruction with no arguments */
        G_cg->write_op(OPC_GETPROPSELF);
        G_cs->write_prop_id(get_prop());
    }
    else
    {
        /* write the varargs modifier if appropriate */
        if (varargs)
            G_cg->write_op(OPC_VARARGC);
        
        /* use the instruction with arguments */
        G_cg->write_op(OPC_CALLPROPSELF);
        G_cs->write((char)argc);
        G_cs->write_prop_id(get_prop());

        /* callpropself removes arguments */
        G_cg->note_pop(argc);
    }

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* if we're not discarding, push the return value from R0 */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}